

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O1

void __thiscall FIntermissionAction::FIntermissionAction(FIntermissionAction *this)

{
  this->_vptr_FIntermissionAction = (_func_int **)&PTR__FIntermissionAction_006f0740;
  (this->mMusic).Chars = FString::NullString.Nothing;
  (this->mBackground).Chars = FString::NullString.Nothing;
  (this->mPalette).Chars = FString::NullString.Nothing;
  (this->mSound).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 4;
  (this->mOverlays).Array = (FIntermissionPatch *)0x0;
  (this->mOverlays).Most = 0;
  (this->mOverlays).Count = 0;
  this->mSize = 0x60;
  this->mClass = DIntermissionScreen::RegistrationInfo.MyClass;
  this->mFlatfill = false;
  this->mMusicLooping = true;
  this->mMusicOrder = 0;
  this->mCdTrack = 0;
  this->mCdId = 0;
  this->mDuration = 0;
  return;
}

Assistant:

FIntermissionAction::FIntermissionAction()
{
	mSize = sizeof(FIntermissionAction);
	mClass = RUNTIME_CLASS(DIntermissionScreen);
	mMusicOrder =
	mCdId = 
	mCdTrack = 
	mDuration = 0;
	mFlatfill = false;
	mMusicLooping = true;
}